

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

DefParamSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefParamSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax> *args_2,
          Token *args_3)

{
  Token defparam;
  Token semi;
  DefParamSyntax *this_00;
  
  this_00 = (DefParamSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DefParamSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (DefParamSyntax *)allocateSlow(this,0xa8,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  defparam.kind = args_1->kind;
  defparam._2_1_ = args_1->field_0x2;
  defparam.numFlags.raw = (args_1->numFlags).raw;
  defparam.rawLen = args_1->rawLen;
  defparam.info = args_1->info;
  semi.kind = args_3->kind;
  semi._2_1_ = args_3->field_0x2;
  semi.numFlags.raw = (args_3->numFlags).raw;
  semi.rawLen = args_3->rawLen;
  semi.info = args_3->info;
  slang::syntax::DefParamSyntax::DefParamSyntax(this_00,args,defparam,args_2,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }